

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cpp
# Opt level: O1

bool fs_is_subdir(string_view subdir,string_view dir)

{
  size_type sVar1;
  int iVar2;
  bool bVar3;
  string d;
  string s;
  string local_78;
  string local_58;
  long *local_38;
  size_t local_30;
  long local_28 [2];
  
  if (dir._M_len == 0 || subdir._M_len == 0) {
    return false;
  }
  fs_drop_slash_abi_cxx11_(&local_58,subdir);
  fs_drop_slash_abi_cxx11_(&local_78,dir);
  sVar1 = local_78._M_string_length;
  if (local_58._M_string_length == local_78._M_string_length) {
    if (local_58._M_string_length == 0) {
LAB_00109519:
      bVar3 = false;
      goto LAB_00109578;
    }
    iVar2 = bcmp(local_58._M_dataplus._M_p,local_78._M_dataplus._M_p,local_58._M_string_length);
    bVar3 = false;
    if ((local_58._M_string_length < sVar1) || (iVar2 == 0)) goto LAB_00109578;
  }
  else if (local_58._M_string_length < local_78._M_string_length) goto LAB_00109519;
  std::__cxx11::string::substr((ulong)&local_38,(ulong)&local_58);
  if (local_30 == local_78._M_string_length) {
    if (local_30 == 0) {
      bVar3 = true;
    }
    else {
      iVar2 = bcmp(local_38,local_78._M_dataplus._M_p,local_30);
      bVar3 = iVar2 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
LAB_00109578:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool
fs_is_subdir(std::string_view subdir, std::string_view dir)
{
  // is subdir a subdirectory of dir. Does not normalize, canonicalize, or walk up the directory tree.
  // ".." is ambiguous and should be avoided in input

  if(subdir.empty() || dir.empty())
    return false;

  std::string const s = fs_drop_slash(subdir);
  std::string const d = fs_drop_slash(dir);

  if(s == d)
    return false;

  if(s.size() < d.size())
    return false;

#ifdef __cpp_lib_starts_ends_with  // C++20
  return s.starts_with(d);
#else
  return s.substr(0, d.size()) == d;
#endif

}